

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall FIX::HttpConnection::HttpConnection(HttpConnection *this,socket_handle s)

{
  __fd_mask *p_Var1;
  uint __i;
  long lVar2;
  
  this->m_socket = s;
  (this->m_parser).m_buffer._M_dataplus._M_p = (pointer)&(this->m_parser).m_buffer.field_2;
  (this->m_parser).m_buffer._M_string_length = 0;
  (this->m_parser).m_buffer.field_2._M_local_buf[0] = '\0';
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    (this->m_fds).fds_bits[lVar2] = 0;
  }
  p_Var1 = (this->m_fds).fds_bits + s / 0x40;
  *p_Var1 = *p_Var1 | 1L << ((byte)s & 0x3f);
  return;
}

Assistant:

HttpConnection::HttpConnection(socket_handle s )
: m_socket( s )
{
  FD_ZERO( &m_fds );
  FD_SET( m_socket, &m_fds );
}